

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faxman.h
# Opt level: O2

bool ClownLZSS::Internal::Faxman::Compress<std::ofstream>
               (uchar *data,size_t data_size,
               CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_> *output)

{
  ulong uVar1;
  bool bVar2;
  _Head_base<0UL,_ClownLZSS_Match_*,_false> _Var3;
  ulong uVar4;
  _Head_base<0UL,_ClownLZSS_Match_*,_false> local_a0;
  uint descriptor_bits_total;
  size_t total_matches;
  pos_type end_position;
  pos_type header_position;
  DescriptorFieldWriter<decltype(output)> descriptor_bits;
  anon_class_16_2_7b5571ae PushDescriptorBit;
  
  local_a0._M_head_impl = (ClownLZSS_Match *)0x0;
  bVar2 = FindOptimalMatches(-1,0x22,0x800,FindExtraMatches,9,GetMatchCost,data,1,data_size,
                             (Matches *)&local_a0,&total_matches,(void *)0x0);
  if (bVar2) {
    header_position =
         OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
         ::Tell(&output->
                 super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
               );
    OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ::Write<2U,_(ClownLZSS::Internal::Endian)1>
              ((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                *)output,0);
    BitField::
    DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
    ::DescriptorFieldWriter(&descriptor_bits,output);
    PushDescriptorBit.descriptor_bits_total = &descriptor_bits_total;
    descriptor_bits_total = 0;
    PushDescriptorBit.descriptor_bits = &descriptor_bits;
    for (_Var3._M_head_impl = local_a0._M_head_impl;
        _Var3._M_head_impl != local_a0._M_head_impl + total_matches;
        _Var3._M_head_impl = _Var3._M_head_impl + 1) {
      if ((_Var3._M_head_impl)->source == (_Var3._M_head_impl)->destination + 1) {
        Compress<std::basic_ofstream<char,_std::char_traits<char>_>_>::anon_class_16_2_7b5571ae::
        operator()(&PushDescriptorBit,true);
        OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
        ::WriteImplementation
                  (&output->
                    super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                   ,data[(_Var3._M_head_impl)->destination]);
      }
      else {
        uVar4 = (_Var3._M_head_impl)->destination - (_Var3._M_head_impl)->source;
        if (uVar4 == 0) {
          uVar4 = 0x800;
        }
        uVar1 = (_Var3._M_head_impl)->length;
        if (uVar4 < 0x101 && uVar1 - 2 < 4) {
          Compress<std::basic_ofstream<char,_std::char_traits<char>_>_>::anon_class_16_2_7b5571ae::
          operator()(&PushDescriptorBit,false);
          Compress<std::basic_ofstream<char,_std::char_traits<char>_>_>::anon_class_16_2_7b5571ae::
          operator()(&PushDescriptorBit,false);
          OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
          ::WriteImplementation
                    (&output->
                      super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                     ,-(char)uVar4);
          Compress<std::basic_ofstream<char,_std::char_traits<char>_>_>::anon_class_16_2_7b5571ae::
          operator()(&PushDescriptorBit,(uVar1 & 2) == 0);
          Compress<std::basic_ofstream<char,_std::char_traits<char>_>_>::anon_class_16_2_7b5571ae::
          operator()(&PushDescriptorBit,(bool)((byte)uVar1 & 1));
        }
        else {
          Compress<std::basic_ofstream<char,_std::char_traits<char>_>_>::anon_class_16_2_7b5571ae::
          operator()(&PushDescriptorBit,false);
          Compress<std::basic_ofstream<char,_std::char_traits<char>_>_>::anon_class_16_2_7b5571ae::
          operator()(&PushDescriptorBit,true);
          OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
          ::WriteImplementation
                    (&output->
                      super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                     ,(uchar)(uVar4 - 1));
          OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
          ::WriteImplementation
                    (&output->
                      super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                     ,(byte)uVar1 - 3 | (byte)(uVar4 - 1 >> 3) & 0xe0);
        }
      }
    }
    end_position = OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                   ::Tell(&output->
                           super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                         );
    OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ::Seek(&output->
            super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
           ,&header_position);
    OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ::Write<2U,_(ClownLZSS::Internal::Endian)1>
              ((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                *)output,(ulong)descriptor_bits_total);
    OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ::Seek(&output->
            super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
           ,&end_position);
    BitField::
    DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
    ::~DescriptorFieldWriter(&descriptor_bits);
  }
  free(local_a0._M_head_impl);
  return bVar2;
}

Assistant:

bool Compress(const unsigned char* const data, const std::size_t data_size, CompressorOutput<T> &output)
			{
				// Produce a series of LZSS compression matches.
				ClownLZSS::Matches matches;
				std::size_t total_matches;
				if (!ClownLZSS::FindOptimalMatches(-1, 0x1F + 3, 0x800, FindExtraMatches, 1 + 8, GetMatchCost, data, 1, data_size, &matches, &total_matches, nullptr))
					return false;

				// Track the location of the header...
				const auto header_position = output.Tell();

				// ...and insert a placeholder there.
				output.WriteLE16(0);

				DescriptorFieldWriter<decltype(output)> descriptor_bits(output);
				unsigned int descriptor_bits_total = 0;

				const auto PushDescriptorBit = [&](const bool value)
				{
					descriptor_bits.Push(value);
					++descriptor_bits_total;
				};

				// Produce Faxman-formatted data.
				for (ClownLZSS_Match *match = &matches[0]; match != &matches[total_matches]; ++match)
				{
					if (CLOWNLZSS_MATCH_IS_LITERAL(match))
					{
						PushDescriptorBit(1);
						output.Write(data[match->destination]);
					}
					else
					{
						const std::size_t distance = match->destination == match->source ? 0x800 : match->destination - match->source;
						const std::size_t length = match->length;

						if (length >= 2 && length <= 5 && distance <= 0x100)
						{
							PushDescriptorBit(0);
							PushDescriptorBit(0);
							output.Write(-distance & 0xFF);
							PushDescriptorBit(!!((length - 2) & 2));
							PushDescriptorBit(!!((length - 2) & 1));
						}
						else //if (length >= 3)
						{
							PushDescriptorBit(0);
							PushDescriptorBit(1);
							output.Write((distance - 1) & 0xFF);
							output.Write((((distance - 1) & 0x700) >> 3) | (length - 3));
						}
					}
				}

				// Grab the current position for later.
				const auto end_position = output.Tell();

				// Rewind to the header...
				output.Seek(header_position);

				// ...and complete it.
				output.WriteLE16(descriptor_bits_total);

				// Seek back to the end of the file just as the caller might expect us to do.
				output.Seek(end_position);

				return true;
			}